

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int derive_secret(ptls_key_schedule_t *sched,void *secret,char *label)

{
  int iVar1;
  uint8_t local_68 [4];
  int ret;
  uint8_t hash_value [64];
  char *label_local;
  void *secret_local;
  ptls_key_schedule_t *sched_local;
  
  (*(sched->hashes[0].ctx)->final)(sched->hashes[0].ctx,local_68,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  iVar1 = derive_secret_with_hash(sched,secret,label,local_68);
  (*ptls_clear_memory)(local_68,0x40);
  return iVar1;
}

Assistant:

static int derive_secret(ptls_key_schedule_t *sched, void *secret, const char *label)
{
    uint8_t hash_value[PTLS_MAX_DIGEST_SIZE];

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, hash_value, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    int ret = derive_secret_with_hash(sched, secret, label, hash_value);
    ptls_clear_memory(hash_value, sizeof(hash_value));
    return ret;
}